

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_10x10(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  int aiStack_178 [82];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  for (lVar15 = 0; (int)lVar15 != 8; lVar15 = lVar15 + 1) {
    lVar22 = (long)*(short *)((long)pvVar4 + lVar15 * 2) * (long)coef_block[lVar15] * 0x2000;
    lVar8 = (long)*(short *)((long)pvVar4 + lVar15 * 2 + 0x40) * (long)coef_block[lVar15 + 0x20];
    lVar18 = lVar8 * 0x249d + lVar22 + 0x400;
    lVar20 = lVar8 * -0xdfc + lVar22 + 0x400;
    lVar9 = (long)*(short *)((long)pvVar4 + lVar15 * 2 + 0x20) * (long)coef_block[lVar15 + 0x10];
    lVar28 = (long)*(short *)((long)pvVar4 + lVar15 * 2 + 0x60) * (long)coef_block[lVar15 + 0x30];
    lVar7 = (lVar28 + lVar9) * 0x1a9a;
    lVar10 = lVar9 * 0x1071 + lVar7;
    lVar7 = lVar28 * -0x45a4 + lVar7;
    lVar9 = lVar10 + lVar18;
    lVar18 = lVar18 - lVar10;
    lVar10 = lVar7 + lVar20;
    lVar20 = lVar20 - lVar7;
    lVar28 = (long)*(short *)((long)pvVar4 + lVar15 * 2 + 0x10) * (long)coef_block[lVar15 + 8];
    lVar12 = (long)*(short *)((long)pvVar4 + lVar15 * 2 + 0x30) * (long)coef_block[lVar15 + 0x18];
    lVar24 = (long)*(short *)((long)pvVar4 + lVar15 * 2 + 0x50) * (long)coef_block[lVar15 + 0x28];
    lVar26 = (long)*(short *)((long)pvVar4 + lVar15 * 2 + 0x70) * (long)coef_block[lVar15 + 0x38];
    lVar7 = lVar26 + lVar12;
    lVar12 = lVar12 - lVar26;
    lVar26 = lVar24 * 0x2000;
    lVar13 = lVar12 * 0x9e3 + lVar26;
    lVar27 = lVar28 * 0x2cb3 + lVar7 * 0x1e6f + lVar13;
    lVar13 = lVar28 * 0x714 + lVar7 * -0x1e6f + lVar13;
    lVar26 = lVar12 * -0x19e3 + lVar26;
    iVar11 = (int)lVar28 - ((int)lVar24 + (int)lVar12);
    lVar12 = (lVar28 * 0x2853 + lVar7 * -0x12cf) - lVar26;
    lVar26 = lVar28 * 0x148c + lVar7 * -0x12cf + lVar26;
    aiStack_178[lVar15] = (int)((ulong)(lVar9 + lVar27) >> 0xb);
    aiStack_178[lVar15 + 0x48] = (int)((ulong)(lVar9 - lVar27) >> 0xb);
    aiStack_178[lVar15 + 8] = (int)((ulong)(lVar12 + lVar10) >> 0xb);
    aiStack_178[lVar15 + 0x40] = (int)((ulong)(lVar10 - lVar12) >> 0xb);
    iVar2 = (int)(lVar22 + lVar8 * -0x2d42 + 0x400U >> 0xb);
    aiStack_178[lVar15 + 0x10] = iVar2 + iVar11 * 4;
    aiStack_178[lVar15 + 0x38] = iVar2 + iVar11 * -4;
    aiStack_178[lVar15 + 0x18] = (int)((ulong)(lVar26 + lVar20) >> 0xb);
    aiStack_178[lVar15 + 0x30] = (int)((ulong)(lVar20 - lVar26) >> 0xb);
    aiStack_178[lVar15 + 0x20] = (int)((ulong)(lVar13 + lVar18) >> 0xb);
    aiStack_178[lVar15 + 0x28] = (int)((ulong)(lVar18 - lVar13) >> 0xb);
  }
  uVar6 = (ulong)output_col;
  for (lVar15 = 0; lVar15 != 0x50; lVar15 = lVar15 + 8) {
    iVar1 = aiStack_178[lVar15 + 1];
    iVar11 = aiStack_178[lVar15] * 0x2000;
    iVar2 = aiStack_178[lVar15 + 4];
    iVar16 = iVar2 * 0x249d + iVar11 + 0x20000;
    iVar17 = iVar2 * -0xdfc + iVar11 + 0x20000;
    iVar19 = iVar2 * -0x2d42 + iVar11 + 0x20000;
    iVar21 = (aiStack_178[lVar15 + 6] + aiStack_178[lVar15 + 2]) * 0x1a9a;
    iVar11 = aiStack_178[lVar15 + 2] * 0x1071 + iVar21;
    iVar21 = aiStack_178[lVar15 + 6] * -0x45a4 + iVar21;
    iVar2 = iVar11 + iVar16;
    iVar16 = iVar16 - iVar11;
    iVar11 = iVar21 + iVar17;
    iVar17 = iVar17 - iVar21;
    iVar21 = aiStack_178[lVar15 + 7] + aiStack_178[lVar15 + 3];
    iVar23 = aiStack_178[lVar15 + 3] - aiStack_178[lVar15 + 7];
    iVar5 = aiStack_178[lVar15 + 5] * 0x2000;
    iVar14 = iVar23 * 0x9e3 + iVar5;
    iVar29 = iVar1 * 0x2cb3 + iVar21 * 0x1e6f + iVar14;
    iVar14 = iVar1 * 0x714 + iVar21 * -0x1e6f + iVar14;
    iVar5 = iVar23 * -0x19e3 + iVar5;
    iVar23 = iVar1 - (iVar23 + aiStack_178[lVar15 + 5]);
    iVar25 = (iVar1 * 0x2853 + iVar21 * -0x12cf) - iVar5;
    iVar5 = iVar1 * 0x148c + iVar21 * -0x12cf + iVar5;
    lVar9 = *(long *)((long)output_buf + lVar15);
    *(JSAMPLE *)(lVar9 + uVar6) = pJVar3[(ulong)((uint)(iVar29 + iVar2) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 9 + uVar6) = pJVar3[(ulong)((uint)(iVar2 - iVar29) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar9 + 1 + uVar6) =
         pJVar3[(ulong)((uint)(iVar11 + iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 8 + uVar6) =
         pJVar3[(ulong)((uint)(iVar11 - iVar25) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 2 + uVar6) =
         pJVar3[(ulong)((uint)(iVar23 * 0x2000 + iVar19) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 7 + uVar6) =
         pJVar3[(ulong)((uint)(iVar19 + iVar23 * -0x2000) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 3 + uVar6) = pJVar3[(ulong)((uint)(iVar5 + iVar17) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar9 + 6 + uVar6) = pJVar3[(ulong)((uint)(iVar17 - iVar5) >> 0x12 & 0x3ff) + 0x80]
    ;
    *(JSAMPLE *)(lVar9 + 4 + uVar6) =
         pJVar3[(ulong)((uint)(iVar14 + iVar16) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar9 + 5 + uVar6) =
         pJVar3[(ulong)((uint)(iVar16 - iVar14) >> 0x12 & 0x3ff) + 0x80];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_10x10(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24;
  JLONG z1, z2, z3, z4, z5;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 10];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z3 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z3 += ONE << (CONST_BITS - PASS1_BITS - 1);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z1 = MULTIPLY(z4, FIX(1.144122806));         /* c4 */
    z2 = MULTIPLY(z4, FIX(0.437016024));         /* c8 */
    tmp10 = z3 + z1;
    tmp11 = z3 - z2;

    tmp22 = RIGHT_SHIFT(z3 - LEFT_SHIFT(z1 - z2, 1),
                        CONST_BITS - PASS1_BITS); /* c0 = (c4-c8)*2 */

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));    /* c6 */
    tmp12 = z1 + MULTIPLY(z2, FIX(0.513743148)); /* c2-c6 */
    tmp13 = z1 - MULTIPLY(z3, FIX(2.176250899)); /* c2+c6 */

    tmp20 = tmp10 + tmp12;
    tmp24 = tmp10 - tmp12;
    tmp21 = tmp11 + tmp13;
    tmp23 = tmp11 - tmp13;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z2 + z4;
    tmp13 = z2 - z4;

    tmp12 = MULTIPLY(tmp13, FIX(0.309016994));        /* (c3-c7)/2 */
    z5 = LEFT_SHIFT(z3, CONST_BITS);

    z2 = MULTIPLY(tmp11, FIX(0.951056516));           /* (c3+c7)/2 */
    z4 = z5 + tmp12;

    tmp10 = MULTIPLY(z1, FIX(1.396802247)) + z2 + z4; /* c1 */
    tmp14 = MULTIPLY(z1, FIX(0.221231742)) - z2 + z4; /* c9 */

    z2 = MULTIPLY(tmp11, FIX(0.587785252));           /* (c1-c9)/2 */
    z4 = z5 - tmp12 - LEFT_SHIFT(tmp13, CONST_BITS - 1);

    tmp12 = LEFT_SHIFT(z1 - tmp13 - z3, PASS1_BITS);

    tmp11 = MULTIPLY(z1, FIX(1.260073511)) - z2 - z4; /* c3 */
    tmp13 = MULTIPLY(z1, FIX(0.642039522)) - z2 + z4; /* c7 */

    /* Final output stage */

    wsptr[8 * 0] = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1] = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2] = (int)(tmp22 + tmp12);
    wsptr[8 * 7] = (int)(tmp22 - tmp12);
    wsptr[8 * 3] = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6] = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4] = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5] = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 10 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 10; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z3 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    z4 = (JLONG)wsptr[4];
    z1 = MULTIPLY(z4, FIX(1.144122806));         /* c4 */
    z2 = MULTIPLY(z4, FIX(0.437016024));         /* c8 */
    tmp10 = z3 + z1;
    tmp11 = z3 - z2;

    tmp22 = z3 - LEFT_SHIFT(z1 - z2, 1);         /* c0 = (c4-c8)*2 */

    z2 = (JLONG)wsptr[2];
    z3 = (JLONG)wsptr[6];

    z1 = MULTIPLY(z2 + z3, FIX(0.831253876));    /* c6 */
    tmp12 = z1 + MULTIPLY(z2, FIX(0.513743148)); /* c2-c6 */
    tmp13 = z1 - MULTIPLY(z3, FIX(2.176250899)); /* c2+c6 */

    tmp20 = tmp10 + tmp12;
    tmp24 = tmp10 - tmp12;
    tmp21 = tmp11 + tmp13;
    tmp23 = tmp11 - tmp13;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    z4 = (JLONG)wsptr[7];

    tmp11 = z2 + z4;
    tmp13 = z2 - z4;

    tmp12 = MULTIPLY(tmp13, FIX(0.309016994));        /* (c3-c7)/2 */

    z2 = MULTIPLY(tmp11, FIX(0.951056516));           /* (c3+c7)/2 */
    z4 = z3 + tmp12;

    tmp10 = MULTIPLY(z1, FIX(1.396802247)) + z2 + z4; /* c1 */
    tmp14 = MULTIPLY(z1, FIX(0.221231742)) - z2 + z4; /* c9 */

    z2 = MULTIPLY(tmp11, FIX(0.587785252));           /* (c1-c9)/2 */
    z4 = z3 - tmp12 - LEFT_SHIFT(tmp13, CONST_BITS - 1);

    tmp12 = LEFT_SHIFT(z1 - tmp13, CONST_BITS) - z3;

    tmp11 = MULTIPLY(z1, FIX(1.260073511)) - z2 - z4; /* c3 */
    tmp13 = MULTIPLY(z1, FIX(0.642039522)) - z2 + z4; /* c7 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[9] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[8] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[7] = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[6] = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[4] = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[5] = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}